

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::ProcessBiPhaseData(ManchesterAnalyzer *this)

{
  U64 location;
  long lVar1;
  ulong uVar2;
  element_type *peVar3;
  long lVar4;
  U64 edge_distance;
  U64 next_edge_location;
  U64 edge_location;
  ManchesterAnalyzer *this_local;
  
  if ((this->mSynchronized & 1U) == 1) {
    location = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToNextEdge();
    lVar1 = AnalyzerChannelData::GetSampleNumber();
    uVar2 = lVar1 - location;
    if ((this->mT * 2 - this->mTError < uVar2) && (uVar2 < this->mT * 2 + this->mTError)) {
      peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
      if (peVar3->mMode == BI_PHASE_MARK) {
        SaveBit(this,location,0);
      }
      else {
        peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
        if (peVar3->mMode == BI_PHASE_SPACE) {
          SaveBit(this,location,1);
        }
      }
    }
    else if ((this->mT - this->mTError < uVar2) && (uVar2 < this->mT + this->mTError)) {
      peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
      if (peVar3->mMode == BI_PHASE_MARK) {
        SaveBit(this,location,1);
      }
      else {
        peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
        if (peVar3->mMode == BI_PHASE_SPACE) {
          SaveBit(this,location,0);
        }
      }
      lVar1 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar4 = AnalyzerChannelData::GetSampleNumber();
      if (((ulong)(lVar4 - lVar1) <= (ulong)(this->mT - this->mTError)) ||
         ((ulong)(this->mT + this->mTError) <= (ulong)(lVar4 - lVar1))) {
        Invalidate(this);
      }
    }
    else {
      peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
      if (peVar3->mMode == BI_PHASE_MARK) {
        SaveBit(this,location,0);
      }
      else {
        peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
        if (peVar3->mMode == BI_PHASE_SPACE) {
          SaveBit(this,location,1);
        }
      }
      Invalidate(this);
    }
  }
  return;
}

Assistant:

void ManchesterAnalyzer::ProcessBiPhaseData()
{
    if( mSynchronized == true )
    {
        U64 edge_location = mManchester->GetSampleNumber();

        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            return;
        }
        else if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 1 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 0 );

            edge_location = mManchester->GetSampleNumber();
            mManchester->AdvanceToNextEdge();
            next_edge_location = mManchester->GetSampleNumber();
            edge_distance = next_edge_location - edge_location;
            if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short.
            {
                return;
            }
            else
            {
                Invalidate();
                return;
                // not synced anymore.
            }
        }
        else
        {
            // record first, then invalidate. (long)
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            Invalidate();
            return;
            // not synced anymore.
        }
    }
    return;
}